

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree.hpp
# Opt level: O2

vector<P_*,_std::allocator<P_*>_> * __thiscall
kdtree::KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less>::queryRectangle
          (vector<P_*,_std::allocator<P_*>_> *__return_storage_ptr__,
          KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less> *this,Node *node,P *searchMin,P *searchMax,
          P *currentRegionMin,P *currentRegionMax,uint depth)

{
  bool bVar1;
  P *regionMin;
  P *destination;
  P *regionMax;
  int i;
  uint dim;
  undefined1 local_68 [8];
  vector<P_*,_std::allocator<P_*>_> resultLeft;
  
  (__return_storage_ptr__->super__Vector_base<P_*,_std::allocator<P_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<P_*,_std::allocator<P_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<P_*,_std::allocator<P_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (node->left == (Node *)0x0) {
    bVar1 = nodeInSearchRange(this,searchMin,searchMax,node);
    if (bVar1) {
      std::vector<P_*,_std::allocator<P_*>_>::push_back(__return_storage_ptr__,&node->value);
    }
  }
  else {
    regionMin = P_new::operator()((P_new *)local_68);
    resultLeft.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)P_new::operator()((P_new *)local_68);
    destination = P_new::operator()((P_new *)local_68);
    regionMax = P_new::operator()((P_new *)local_68);
    for (dim = 0; dim != 3; dim = dim + 1) {
      P_set::operator()((P_set *)local_68,regionMin,currentRegionMin,dim);
      P_set::operator()((P_set *)local_68,
                        (P *)resultLeft.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,currentRegionMax,dim);
      P_set::operator()((P_set *)local_68,destination,currentRegionMin,dim);
      P_set::operator()((P_set *)local_68,regionMax,currentRegionMax,dim);
    }
    P_set::operator()((P_set *)local_68,
                      (P *)resultLeft.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,node->value,depth % 3);
    P_set::operator()((P_set *)local_68,destination,node->value,depth % 3);
    bVar1 = regionContained(this,searchMin,searchMax,regionMin,
                            (P *)resultLeft.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
    if (bVar1) {
      reportSubtree(this,node->left,__return_storage_ptr__);
    }
    else {
      bVar1 = regionIntersects(this,searchMin,searchMax,regionMin,
                               (P *)resultLeft.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl
                                    .super__Vector_impl_data._M_end_of_storage);
      if (bVar1) {
        queryRectangle((vector<P_*,_std::allocator<P_*>_> *)local_68,this,node->left,searchMin,
                       searchMax,regionMin,
                       (P *)resultLeft.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,depth + 1);
        std::vector<P*,std::allocator<P*>>::
        insert<__gnu_cxx::__normal_iterator<P**,std::vector<P*,std::allocator<P*>>>,void>
                  ((vector<P*,std::allocator<P*>> *)__return_storage_ptr__,
                   (const_iterator)
                   (__return_storage_ptr__->super__Vector_base<P_*,_std::allocator<P_*>_>)._M_impl.
                   super__Vector_impl_data._M_finish,
                   (__normal_iterator<P_**,_std::vector<P_*,_std::allocator<P_*>_>_>)local_68,
                   (__normal_iterator<P_**,_std::vector<P_*,_std::allocator<P_*>_>_>)
                   resultLeft.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
                   super__Vector_impl_data._M_start);
        std::_Vector_base<P_*,_std::allocator<P_*>_>::~_Vector_base
                  ((_Vector_base<P_*,_std::allocator<P_*>_> *)local_68);
      }
    }
    bVar1 = regionContained(this,searchMin,searchMax,destination,regionMax);
    if (bVar1) {
      reportSubtree(this,node->right,__return_storage_ptr__);
    }
    else {
      bVar1 = regionIntersects(this,searchMin,searchMax,destination,regionMax);
      if (bVar1) {
        queryRectangle((vector<P_*,_std::allocator<P_*>_> *)local_68,this,node->right,searchMin,
                       searchMax,destination,regionMax,depth + 1);
        std::vector<P*,std::allocator<P*>>::
        insert<__gnu_cxx::__normal_iterator<P**,std::vector<P*,std::allocator<P*>>>,void>
                  ((vector<P*,std::allocator<P*>> *)__return_storage_ptr__,
                   (const_iterator)
                   (__return_storage_ptr__->super__Vector_base<P_*,_std::allocator<P_*>_>)._M_impl.
                   super__Vector_impl_data._M_finish,
                   (__normal_iterator<P_**,_std::vector<P_*,_std::allocator<P_*>_>_>)local_68,
                   (__normal_iterator<P_**,_std::vector<P_*,_std::allocator<P_*>_>_>)
                   resultLeft.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
                   super__Vector_impl_data._M_start);
        std::_Vector_base<P_*,_std::allocator<P_*>_>::~_Vector_base
                  ((_Vector_base<P_*,_std::allocator<P_*>_> *)local_68);
      }
    }
    P_delete::operator()((P_delete *)local_68,regionMin);
    P_delete::operator()
              ((P_delete *)local_68,
               (P *)resultLeft.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
    P_delete::operator()((P_delete *)local_68,destination);
    P_delete::operator()((P_delete *)local_68,regionMax);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T*> queryRectangle(Node * const node, T * const searchMin, T * const searchMax, T * const currentRegionMin, T * const currentRegionMax, const unsigned int depth) const {
			std::vector<T*> result;

			// if node->left == nullptr then also node->right == nullptr.
			// this means we reached a leaf of the tree
			if (node->left == nullptr) {
				// if the leaf is within the search range, add it to the result vector
				if (nodeInSearchRange(searchMin, searchMax, node)) {
					result.push_back(node->value);
				}
			}
			else {
				T *leftRegionMin = NEW()();
				T *leftRegionMax = NEW()();
				T *rightRegionMin = NEW()();
				T *rightRegionMax = NEW()();

				for (int i = 0; i < dim; i++) {
					SET()(leftRegionMin, currentRegionMin, i);
					SET()(leftRegionMax, currentRegionMax, i);
					SET()(rightRegionMin, currentRegionMin, i);
					SET()(rightRegionMax, currentRegionMax, i);
				}

				SET()(leftRegionMax, node->value, depth%dim);
				SET()(rightRegionMin, node->value, depth%dim);

				if (regionContained(searchMin, searchMax, leftRegionMin, leftRegionMax)) {
					reportSubtree(node->left, &result);
				}
				else {
					if (regionIntersects(searchMin, searchMax, leftRegionMin, leftRegionMax)) {
						std::vector<T*> resultLeft = queryRectangle(node->left, searchMin, searchMax, leftRegionMin, leftRegionMax, depth + 1);
						result.insert(result.end(), resultLeft.begin(), resultLeft.end());
					}
				}

				if (regionContained(searchMin, searchMax, rightRegionMin, rightRegionMax)) {
					reportSubtree(node->right, &result);
				}
				else {
					if (regionIntersects(searchMin, searchMax, rightRegionMin, rightRegionMax)) {
						std::vector<T*> resultRight = queryRectangle(node->right, searchMin, searchMax, rightRegionMin, rightRegionMax, depth + 1);
						result.insert(result.end(), resultRight.begin(), resultRight.end());
					}
				}

				DELETE()(leftRegionMin);
				DELETE()(leftRegionMax);
				DELETE()(rightRegionMin);
				DELETE()(rightRegionMax);
			}
			return result;
		}